

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
         *this,size_t i)

{
  float fVar1;
  undefined4 uVar2;
  uint uVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  char *pcVar5;
  size_t sVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  
  pBVar4 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           vertices.items;
  pcVar5 = (pBVar4->super_RawBufferView).ptr_ofs;
  sVar6 = (pBVar4->super_RawBufferView).stride;
  uVar3 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                 super_CurveGeometry.field_0x68);
  fVar1 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          maxRadiusScale;
  lVar14 = uVar3 * sVar6;
  fVar9 = fVar1 * *(float *)(pcVar5 + lVar14 + 0xc);
  auVar19._4_4_ = fVar9;
  auVar19._0_4_ = fVar9;
  auVar19._8_4_ = fVar9;
  auVar19._12_4_ = fVar9;
  auVar19._16_4_ = fVar9;
  auVar19._20_4_ = fVar9;
  auVar19._24_4_ = fVar9;
  auVar19._28_4_ = fVar9;
  lVar11 = (uVar3 + 1) * sVar6;
  fVar9 = fVar1 * *(float *)(pcVar5 + lVar11 + 0xc);
  auVar20._4_4_ = fVar9;
  auVar20._0_4_ = fVar9;
  auVar20._8_4_ = fVar9;
  auVar20._12_4_ = fVar9;
  auVar20._16_4_ = fVar9;
  auVar20._20_4_ = fVar9;
  auVar20._24_4_ = fVar9;
  auVar20._28_4_ = fVar9;
  lVar12 = (uVar3 + 2) * sVar6;
  fVar9 = fVar1 * *(float *)(pcVar5 + lVar12 + 0xc);
  auVar17._4_4_ = fVar9;
  auVar17._0_4_ = fVar9;
  auVar17._8_4_ = fVar9;
  auVar17._12_4_ = fVar9;
  auVar17._16_4_ = fVar9;
  auVar17._20_4_ = fVar9;
  auVar17._24_4_ = fVar9;
  auVar17._28_4_ = fVar9;
  lVar13 = (uVar3 + 3) * sVar6;
  fVar1 = fVar1 * *(float *)(pcVar5 + lVar13 + 0xc);
  auVar31._0_4_ = fVar1 * catmullrom_basis0._3944_4_;
  auVar31._4_4_ = fVar1 * catmullrom_basis0._3948_4_;
  auVar31._8_4_ = fVar1 * catmullrom_basis0._3952_4_;
  auVar31._12_4_ = fVar1 * catmullrom_basis0._3956_4_;
  auVar31._16_4_ = fVar1 * catmullrom_basis0._3960_4_;
  auVar31._20_4_ = fVar1 * catmullrom_basis0._3964_4_;
  auVar31._24_4_ = fVar1 * catmullrom_basis0._3968_4_;
  auVar31._28_4_ = 0;
  auVar33 = vfmadd231ps_fma(auVar31,catmullrom_basis0._2788_32_,auVar17);
  auVar33 = vfmadd231ps_fma(ZEXT1632(auVar33),catmullrom_basis0._1632_32_,auVar20);
  auVar15 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  auVar33 = vfmadd231ps_fma(ZEXT1632(auVar33),catmullrom_basis0._476_32_,auVar19);
  auVar16 = vmaxps_avx512vl(auVar15,ZEXT1632(auVar33));
  auVar18._4_4_ = catmullrom_basis0._8572_4_ * fVar1;
  auVar18._0_4_ = catmullrom_basis0._8568_4_ * fVar1;
  auVar18._8_4_ = catmullrom_basis0._8576_4_ * fVar1;
  auVar18._12_4_ = catmullrom_basis0._8580_4_ * fVar1;
  auVar18._16_4_ = catmullrom_basis0._8584_4_ * fVar1;
  auVar18._20_4_ = catmullrom_basis0._8588_4_ * fVar1;
  auVar18._24_4_ = catmullrom_basis0._8592_4_ * fVar1;
  auVar18._28_4_ = fVar1;
  auVar34 = vfmadd231ps_fma(auVar18,catmullrom_basis0._7412_32_,auVar17);
  auVar34 = vfmadd231ps_fma(ZEXT1632(auVar34),catmullrom_basis0._6256_32_,auVar20);
  auVar34 = vfmadd231ps_fma(ZEXT1632(auVar34),catmullrom_basis0._5100_32_,auVar19);
  auVar29._8_4_ = 0x3d638e39;
  auVar29._0_8_ = 0x3d638e393d638e39;
  auVar29._12_4_ = 0x3d638e39;
  auVar29._16_4_ = 0x3d638e39;
  auVar29._20_4_ = 0x3d638e39;
  auVar29._24_4_ = 0x3d638e39;
  auVar29._28_4_ = 0x3d638e39;
  auVar19 = ZEXT1632(CONCAT412(auVar34._12_4_ * 0.055555556,
                               CONCAT48(auVar34._8_4_ * 0.055555556,
                                        CONCAT44(auVar34._4_4_ * 0.055555556,
                                                 auVar34._0_4_ * 0.055555556))));
  auVar34 = ZEXT816(0) << 0x40;
  auVar18 = vblendps_avx(auVar19,ZEXT1632(auVar34),1);
  auVar31 = vsubps_avx(ZEXT1632(auVar33),auVar18);
  auVar18 = vblendps_avx(auVar19,ZEXT1632(auVar34),0x80);
  auVar36._0_4_ = auVar33._0_4_ + auVar18._0_4_;
  auVar36._4_4_ = auVar33._4_4_ + auVar18._4_4_;
  auVar36._8_4_ = auVar33._8_4_ + auVar18._8_4_;
  auVar36._12_4_ = auVar33._12_4_ + auVar18._12_4_;
  auVar36._16_4_ = auVar18._16_4_ + 0.0;
  auVar36._20_4_ = auVar18._20_4_ + 0.0;
  auVar36._24_4_ = auVar18._24_4_ + 0.0;
  auVar36._28_4_ = auVar18._28_4_ + 0.0;
  auVar18 = vmaxps_avx(auVar31,auVar36);
  auVar17 = vmaxps_avx512vl(auVar16,auVar18);
  uVar2 = *(undefined4 *)(pcVar5 + lVar14 + 8);
  auVar22._4_4_ = uVar2;
  auVar22._0_4_ = uVar2;
  auVar22._8_4_ = uVar2;
  auVar22._12_4_ = uVar2;
  auVar22._16_4_ = uVar2;
  auVar22._20_4_ = uVar2;
  auVar22._24_4_ = uVar2;
  auVar22._28_4_ = uVar2;
  auVar18 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar11 + 8)));
  auVar16 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar12 + 8)));
  auVar19 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar13 + 8)));
  auVar20 = vmulps_avx512vl(auVar19,catmullrom_basis0._3944_32_);
  auVar20 = vfmadd231ps_avx512vl(auVar20,catmullrom_basis0._2788_32_,auVar16);
  auVar20 = vfmadd231ps_avx512vl(auVar20,catmullrom_basis0._1632_32_,auVar18);
  auVar21 = vfmadd231ps_avx512vl(auVar20,catmullrom_basis0._476_32_,auVar22);
  auVar20 = vmaxps_avx512vl(auVar15,auVar21);
  auVar19 = vmulps_avx512vl(auVar19,catmullrom_basis0._8568_32_);
  auVar16 = vfmadd231ps_avx512vl(auVar19,catmullrom_basis0._7412_32_,auVar16);
  auVar18 = vfmadd231ps_avx512vl(auVar16,catmullrom_basis0._6256_32_,auVar18);
  auVar18 = vfmadd231ps_avx512vl(auVar18,catmullrom_basis0._5100_32_,auVar22);
  auVar16 = vmulps_avx512vl(auVar18,auVar29);
  auVar27 = ZEXT1632(auVar34);
  auVar18 = vblendps_avx(auVar16,auVar27,1);
  auVar19 = vsubps_avx512vl(auVar21,auVar18);
  auVar18 = vblendps_avx(auVar16,auVar27,0x80);
  auVar16 = vaddps_avx512vl(auVar21,auVar18);
  auVar18 = vmaxps_avx512vl(auVar19,auVar16);
  auVar22 = vmaxps_avx512vl(auVar20,auVar18);
  auVar18 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar14 + 4)));
  auVar20 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar11 + 4)));
  auVar23 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar12 + 4)));
  auVar24 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar13 + 4)));
  auVar25 = vmulps_avx512vl(auVar24,catmullrom_basis0._3944_32_);
  auVar25 = vfmadd231ps_avx512vl(auVar25,catmullrom_basis0._2788_32_,auVar23);
  auVar25 = vfmadd231ps_avx512vl(auVar25,catmullrom_basis0._1632_32_,auVar20);
  auVar25 = vfmadd231ps_avx512vl(auVar25,catmullrom_basis0._476_32_,auVar18);
  auVar26 = vmaxps_avx512vl(auVar15,auVar25);
  auVar24 = vmulps_avx512vl(auVar24,catmullrom_basis0._8568_32_);
  auVar23 = vfmadd231ps_avx512vl(auVar24,catmullrom_basis0._7412_32_,auVar23);
  auVar20 = vfmadd231ps_avx512vl(auVar23,catmullrom_basis0._6256_32_,auVar20);
  auVar18 = vfmadd231ps_avx512vl(auVar20,catmullrom_basis0._5100_32_,auVar18);
  auVar20 = vmulps_avx512vl(auVar18,auVar29);
  auVar18 = vblendps_avx(auVar20,auVar27,1);
  auVar23 = vsubps_avx512vl(auVar25,auVar18);
  auVar18 = vblendps_avx(auVar20,auVar27,0x80);
  auVar24 = vaddps_avx512vl(auVar25,auVar18);
  auVar18 = vmaxps_avx512vl(auVar23,auVar24);
  auVar26 = vmaxps_avx512vl(auVar26,auVar18);
  auVar18 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar14)));
  auVar20 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar11)));
  auVar27 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar12)));
  auVar28 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar13)));
  auVar29 = vmulps_avx512vl(auVar28,catmullrom_basis0._3944_32_);
  auVar29 = vfmadd231ps_avx512vl(auVar29,auVar27,catmullrom_basis0._2788_32_);
  auVar29 = vfmadd231ps_avx512vl(auVar29,auVar20,catmullrom_basis0._1632_32_);
  auVar29 = vfmadd231ps_avx512vl(auVar29,auVar18,catmullrom_basis0._476_32_);
  auVar30 = vmaxps_avx512vl(auVar15,auVar29);
  auVar15 = vmulps_avx512vl(auVar28,catmullrom_basis0._8568_32_);
  auVar15 = vfmadd231ps_avx512vl(auVar15,catmullrom_basis0._7412_32_,auVar27);
  auVar15 = vfmadd231ps_avx512vl(auVar15,catmullrom_basis0._6256_32_,auVar20);
  auVar18 = vfmadd231ps_avx512vl(auVar15,catmullrom_basis0._5100_32_,auVar18);
  auVar15._4_4_ = auVar18._4_4_ * 0.055555556;
  auVar15._0_4_ = auVar18._0_4_ * 0.055555556;
  auVar15._8_4_ = auVar18._8_4_ * 0.055555556;
  auVar15._12_4_ = auVar18._12_4_ * 0.055555556;
  auVar15._16_4_ = auVar18._16_4_ * 0.055555556;
  auVar15._20_4_ = auVar18._20_4_ * 0.055555556;
  auVar15._24_4_ = auVar18._24_4_ * 0.055555556;
  auVar15._28_4_ = auVar18._28_4_;
  auVar18 = vblendps_avx(auVar15,ZEXT1632(auVar34),1);
  auVar20 = vsubps_avx(auVar29,auVar18);
  auVar18 = vblendps_avx(auVar15,ZEXT1632(auVar34),0x80);
  auVar27._0_4_ = auVar29._0_4_ + auVar18._0_4_;
  auVar27._4_4_ = auVar29._4_4_ + auVar18._4_4_;
  auVar27._8_4_ = auVar29._8_4_ + auVar18._8_4_;
  auVar27._12_4_ = auVar29._12_4_ + auVar18._12_4_;
  auVar27._16_4_ = auVar29._16_4_ + auVar18._16_4_;
  auVar27._20_4_ = auVar29._20_4_ + auVar18._20_4_;
  auVar27._24_4_ = auVar29._24_4_ + auVar18._24_4_;
  auVar27._28_4_ = auVar29._28_4_ + auVar18._28_4_;
  auVar18 = vmaxps_avx(auVar20,auVar27);
  auVar18 = vmaxps_avx(auVar30,auVar18);
  auVar28._8_4_ = 0x7f800000;
  auVar28._0_8_ = 0x7f8000007f800000;
  auVar28._12_4_ = 0x7f800000;
  auVar28._16_4_ = 0x7f800000;
  auVar28._20_4_ = 0x7f800000;
  auVar28._24_4_ = 0x7f800000;
  auVar28._28_4_ = 0x7f800000;
  auVar15 = vminps_avx(auVar28,ZEXT1632(auVar33));
  auVar31 = vminps_avx(auVar31,auVar36);
  auVar15 = vminps_avx(auVar15,auVar31);
  auVar31 = vminps_avx512vl(auVar28,auVar21);
  auVar16 = vminps_avx512vl(auVar19,auVar16);
  auVar31 = vminps_avx(auVar31,auVar16);
  auVar19 = vminps_avx512vl(auVar28,auVar25);
  auVar16 = vminps_avx(auVar23,auVar24);
  auVar16 = vminps_avx(auVar19,auVar16);
  auVar19 = vminps_avx(auVar28,auVar29);
  auVar20 = vminps_avx(auVar20,auVar27);
  auVar19 = vminps_avx(auVar19,auVar20);
  auVar20 = vshufps_avx(auVar19,auVar19,0xb1);
  auVar19 = vminps_avx(auVar19,auVar20);
  auVar20 = vshufpd_avx(auVar19,auVar19,5);
  auVar19 = vminps_avx(auVar19,auVar20);
  auVar33 = vminps_avx(auVar19._0_16_,auVar19._16_16_);
  auVar19 = vshufps_avx(auVar16,auVar16,0xb1);
  auVar16 = vminps_avx(auVar16,auVar19);
  auVar19 = vshufpd_avx(auVar16,auVar16,5);
  auVar16 = vminps_avx(auVar16,auVar19);
  auVar34 = vminps_avx(auVar16._0_16_,auVar16._16_16_);
  auVar34 = vunpcklps_avx(auVar33,auVar34);
  auVar16 = vshufps_avx(auVar31,auVar31,0xb1);
  auVar31 = vminps_avx(auVar31,auVar16);
  auVar16 = vshufpd_avx(auVar31,auVar31,5);
  auVar31 = vminps_avx(auVar31,auVar16);
  auVar33 = vminps_avx(auVar31._0_16_,auVar31._16_16_);
  auVar7 = vinsertps_avx(auVar34,auVar33,0x28);
  auVar31 = vshufps_avx(auVar18,auVar18,0xb1);
  auVar18 = vmaxps_avx(auVar18,auVar31);
  auVar31 = vshufpd_avx(auVar18,auVar18,5);
  auVar18 = vmaxps_avx(auVar18,auVar31);
  auVar33 = vmaxps_avx(auVar18._0_16_,auVar18._16_16_);
  auVar18 = vshufps_avx512vl(auVar26,auVar26,0xb1);
  auVar31 = vmaxps_avx512vl(auVar26,auVar18);
  auVar18 = vshufpd_avx(auVar31,auVar31,5);
  auVar18 = vmaxps_avx(auVar31,auVar18);
  auVar34 = vmaxps_avx(auVar18._0_16_,auVar18._16_16_);
  auVar34 = vunpcklps_avx(auVar33,auVar34);
  auVar18 = vshufps_avx512vl(auVar22,auVar22,0xb1);
  auVar31 = vmaxps_avx512vl(auVar22,auVar18);
  auVar18 = vshufpd_avx(auVar31,auVar31,5);
  auVar18 = vmaxps_avx(auVar31,auVar18);
  auVar33 = vmaxps_avx(auVar18._0_16_,auVar18._16_16_);
  auVar8 = vinsertps_avx(auVar34,auVar33,0x28);
  auVar18 = vshufps_avx(auVar15,auVar15,0xb1);
  auVar18 = vminps_avx(auVar15,auVar18);
  auVar15 = vshufpd_avx(auVar18,auVar18,5);
  auVar18 = vminps_avx(auVar18,auVar15);
  auVar33 = vminss_avx(auVar18._0_16_,auVar18._16_16_);
  auVar18 = vshufps_avx512vl(auVar17,auVar17,0xb1);
  auVar15 = vmaxps_avx512vl(auVar17,auVar18);
  auVar18 = vshufpd_avx(auVar15,auVar15,5);
  auVar18 = vmaxps_avx(auVar15,auVar18);
  auVar34 = vmaxss_avx(auVar18._0_16_,auVar18._16_16_);
  auVar35._8_4_ = 0x7fffffff;
  auVar35._0_8_ = 0x7fffffff7fffffff;
  auVar35._12_4_ = 0x7fffffff;
  auVar33 = vandps_avx(auVar33,auVar35);
  auVar34 = vandps_avx(auVar34,auVar35);
  auVar33 = vmaxss_avx(auVar34,auVar33);
  auVar33._4_4_ = auVar33._0_4_;
  auVar33._8_4_ = auVar33._0_4_;
  auVar33._12_4_ = auVar33._0_4_;
  auVar7 = vsubps_avx(auVar7,auVar33);
  auVar32._0_4_ = auVar8._0_4_ + auVar33._0_4_;
  auVar32._4_4_ = auVar8._4_4_ + auVar33._0_4_;
  auVar32._8_4_ = auVar8._8_4_ + auVar33._0_4_;
  auVar32._12_4_ = auVar8._12_4_ + auVar33._0_4_;
  auVar33 = vandps_avx(auVar7,auVar35);
  auVar34 = vandps_avx(auVar32,auVar35);
  auVar33 = vmaxps_avx(auVar33,auVar34);
  auVar34 = vmovshdup_avx(auVar33);
  auVar34 = vmaxss_avx(auVar34,auVar33);
  auVar33 = vshufpd_avx(auVar33,auVar33,1);
  auVar33 = vmaxss_avx(auVar33,auVar34);
  fVar1 = auVar33._0_4_ * 4.7683716e-07;
  auVar34._4_4_ = fVar1;
  auVar34._0_4_ = fVar1;
  auVar34._8_4_ = fVar1;
  auVar34._12_4_ = fVar1;
  aVar10 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar7,auVar34);
  (__return_storage_ptr__->lower).field_0 = aVar10;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar32._0_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar32._4_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar32._8_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar32._12_4_ + fVar1;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(size_t i) const {
        return bounds(i);
      }